

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_tree.cpp
# Opt level: O1

int main(void)

{
  undefined8 *puVar1;
  BehaviorNode<Body_&> *pBVar2;
  _func_int **pp_Var3;
  pointer *__ptr;
  __single_object peelRightArm;
  __single_object peelLeftArm;
  Body body;
  _Head_base<0UL,_TBT::BehaviorNode<Body_&>_*,_false> local_88;
  PeelLeftArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&> *local_80;
  _Head_base<0UL,_TBT::BehaviorNode<Body_&>_*,_false> local_78;
  undefined4 *local_70;
  undefined8 local_68;
  undefined4 local_60;
  undefined4 uStack_5c;
  long *local_50;
  undefined8 local_48;
  long local_40;
  undefined2 local_38;
  
  local_60 = 0x7466656c;
  local_68 = 7;
  uStack_5c = 0x6d7241;
  local_50 = &local_40;
  local_40 = 0x7241747468676972;
  local_38 = 0x6d;
  local_48 = 9;
  local_70 = &local_60;
  puVar1 = (undefined8 *)operator_new(0x28);
  puVar1[1] = 0;
  *puVar1 = &PTR_tick_00103c80;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  pBVar2 = (BehaviorNode<Body_&> *)operator_new(0x18);
  (pBVar2->super_BehaviorNodeBase).parent = (BehaviorNodeBase *)0x0;
  pBVar2[1]._vptr_BehaviorNode = (_func_int **)0x0;
  pBVar2->_vptr_BehaviorNode = (_func_int **)&PTR_tick_00103ce8;
  local_80 = (PeelLeftArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&> *)pBVar2;
  pp_Var3 = (_func_int **)operator_new(0x10);
  local_88._M_head_impl = (BehaviorNode<Body_&> *)local_80;
  *pp_Var3 = (_func_int *)0x0;
  pp_Var3[1] = (_func_int *)0x0;
  *pp_Var3 = (_func_int *)&PTR_tick_00103d38;
  pp_Var3[1] = (_func_int *)&pBVar2->super_BehaviorNodeBase;
  pBVar2[1]._vptr_BehaviorNode = pp_Var3;
  local_80 = (PeelLeftArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&> *)0x0;
  ((BehaviorNodeBase *)((long)local_88._M_head_impl + 8))->parent = (BehaviorNodeBase *)(puVar1 + 1)
  ;
  std::
  vector<std::unique_ptr<TBT::BehaviorNode<Body&>,std::default_delete<TBT::BehaviorNode<Body&>>>,std::allocator<std::unique_ptr<TBT::BehaviorNode<Body&>,std::default_delete<TBT::BehaviorNode<Body&>>>>>
  ::
  emplace_back<std::unique_ptr<TBT::BehaviorNode<Body&>,std::default_delete<TBT::BehaviorNode<Body&>>>>
            ((vector<std::unique_ptr<TBT::BehaviorNode<Body&>,std::default_delete<TBT::BehaviorNode<Body&>>>,std::allocator<std::unique_ptr<TBT::BehaviorNode<Body&>,std::default_delete<TBT::BehaviorNode<Body&>>>>>
              *)(puVar1 + 2),
             (unique_ptr<TBT::BehaviorNode<Body_&>,_std::default_delete<TBT::BehaviorNode<Body_&>_>_>
              *)&local_88);
  if (local_88._M_head_impl != (BehaviorNode<Body_&> *)0x0) {
    operator_delete(local_88._M_head_impl,0x10);
  }
  pBVar2 = (BehaviorNode<Body_&> *)operator_new(0x18);
  (pBVar2->super_BehaviorNodeBase).parent = (BehaviorNodeBase *)0x0;
  pBVar2[1]._vptr_BehaviorNode = (_func_int **)0x0;
  pBVar2->_vptr_BehaviorNode = (_func_int **)&PTR_tick_00103d90;
  local_88._M_head_impl = pBVar2;
  pp_Var3 = (_func_int **)operator_new(0x10);
  local_78._M_head_impl = local_88._M_head_impl;
  *pp_Var3 = (_func_int *)0x0;
  pp_Var3[1] = (_func_int *)0x0;
  *pp_Var3 = (_func_int *)&PTR_tick_00103d38;
  pp_Var3[1] = (_func_int *)&pBVar2->super_BehaviorNodeBase;
  pBVar2[1]._vptr_BehaviorNode = pp_Var3;
  local_88._M_head_impl = (BehaviorNode<Body_&> *)0x0;
  ((local_78._M_head_impl)->super_BehaviorNodeBase).parent = (BehaviorNodeBase *)(puVar1 + 1);
  std::
  vector<std::unique_ptr<TBT::BehaviorNode<Body&>,std::default_delete<TBT::BehaviorNode<Body&>>>,std::allocator<std::unique_ptr<TBT::BehaviorNode<Body&>,std::default_delete<TBT::BehaviorNode<Body&>>>>>
  ::
  emplace_back<std::unique_ptr<TBT::BehaviorNode<Body&>,std::default_delete<TBT::BehaviorNode<Body&>>>>
            ((vector<std::unique_ptr<TBT::BehaviorNode<Body&>,std::default_delete<TBT::BehaviorNode<Body&>>>,std::allocator<std::unique_ptr<TBT::BehaviorNode<Body&>,std::default_delete<TBT::BehaviorNode<Body&>>>>>
              *)(puVar1 + 2),
             (unique_ptr<TBT::BehaviorNode<Body_&>,_std::default_delete<TBT::BehaviorNode<Body_&>_>_>
              *)&local_78);
  if (local_78._M_head_impl != (BehaviorNode<Body_&> *)0x0) {
    operator_delete(local_78._M_head_impl,0x10);
  }
  (**(code **)*puVar1)(puVar1,&local_70);
  if ((PeelRightArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&> *)local_88._M_head_impl !=
      (PeelRightArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&> *)0x0) {
    std::default_delete<TBT::PeelRightArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&>_>::
    operator()((default_delete<TBT::PeelRightArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&>_> *)
               &local_88,
               (PeelRightArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&> *)local_88._M_head_impl)
    ;
  }
  if (local_80 != (PeelLeftArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&> *)0x0) {
    std::default_delete<TBT::PeelLeftArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&>_>::
    operator()((default_delete<TBT::PeelLeftArmPeelNodeMacro<TBT::PeelNodeBase<Body_&>,_Arm_&>_> *)
               &local_80,local_80);
  }
  operator_delete(puVar1,0x10);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT44(uStack_5c,local_60) + 1);
  }
  return 0;
}

Assistant:

int main()
{
    Body body;


    BehaviorTree<Body&> tree;

    auto rootNode = std::make_unique<SequenceNode<Body&>>();
    auto peelLeftArm = std::make_unique<PeelLeftArm>();
    peelLeftArm->setChild(std::make_unique<PrintArmNode>());
    rootNode->addChild(std::move(peelLeftArm));
    auto peelRightArm = std::make_unique<PeelRightArm>();
    peelRightArm->setChild(std::make_unique<PrintArmNode>());
    rootNode->addChild(std::move(peelRightArm));

    tree.setRoot(std::move(rootNode));

    tree.tickRoot(body);

    return 0;
}